

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
          (RandomViewport *this,RenderTarget *renderTarget,int preferredWidth,int preferredHeight,
          deUint32 seed)

{
  int iVar1;
  Random rnd;
  deRandom dStack_28;
  
  this->x = 0;
  this->y = 0;
  iVar1 = renderTarget->m_width;
  if (preferredWidth < renderTarget->m_width) {
    iVar1 = preferredWidth;
  }
  this->width = iVar1;
  iVar1 = renderTarget->m_height;
  if (preferredHeight < renderTarget->m_height) {
    iVar1 = preferredHeight;
  }
  this->height = iVar1;
  deRandom_init(&dStack_28,seed);
  iVar1 = de::Random::getInt((Random *)&dStack_28,0,renderTarget->m_width - this->width);
  this->x = iVar1;
  iVar1 = de::Random::getInt((Random *)&dStack_28,0,renderTarget->m_height - this->height);
  this->y = iVar1;
  return;
}

Assistant:

RandomViewport::RandomViewport (const tcu::RenderTarget& renderTarget, int preferredWidth, int preferredHeight, deUint32 seed)
	: x			(0)
	, y			(0)
	, width		(deMin32(preferredWidth, renderTarget.getWidth()))
	, height	(deMin32(preferredHeight, renderTarget.getHeight()))
{
	de::Random rnd(seed);
	x = rnd.getInt(0, renderTarget.getWidth()	- width);
	y = rnd.getInt(0, renderTarget.getHeight()	- height);
}